

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextRecord.test.cpp
# Opt level: O1

void verifyChunk(TextRecord *chunk)

{
  int iVar1;
  StringRef macroName;
  StringRef macroName_00;
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  AssertionHandler catchAssertionHandler;
  ITransientExpression local_a0;
  char *local_90;
  char *local_88;
  undefined8 local_80;
  TextRecord *local_78;
  AssertionHandler local_70;
  
  local_a0._vptr_ITransientExpression = (_func_int **)0x1883ac;
  local_a0.m_isBinaryExpression = true;
  local_a0.m_result = false;
  local_a0._10_6_ = 0;
  macroName.m_size = 5;
  macroName.m_start = "CHECK";
  capturedExpression.m_size = 0x54;
  capturedExpression.m_start =
       "\"The new R-matrix analysis of the N-N system on which the ENDF/B-  \" == chunk.text()";
  Catch::AssertionHandler::AssertionHandler
            (&local_70,macroName,(SourceLineInfo *)&local_a0,capturedExpression,ContinueOnFailure);
  iVar1 = std::__cxx11::string::compare((char *)chunk);
  local_a0.m_result = iVar1 == 0;
  local_a0.m_isBinaryExpression = true;
  local_a0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001be3a8;
  local_90 = "The new R-matrix analysis of the N-N system on which the ENDF/B-  ";
  local_88 = "==";
  local_80 = 2;
  local_78 = chunk;
  Catch::AssertionHandler::handleExpr(&local_70,&local_a0);
  Catch::ITransientExpression::~ITransientExpression(&local_a0);
  Catch::AssertionHandler::complete(&local_70);
  if (local_70.m_completed == false) {
    (*(local_70.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_a0._vptr_ITransientExpression = (_func_int **)0x1883ac;
  local_a0.m_isBinaryExpression = true;
  local_a0.m_result = false;
  local_a0._10_6_ = 0;
  macroName_00.m_size = 5;
  macroName_00.m_start = "CHECK";
  capturedExpression_00.m_size = 0xf;
  capturedExpression_00.m_start = "1 == chunk.NC()";
  Catch::AssertionHandler::AssertionHandler
            (&local_70,macroName_00,(SourceLineInfo *)&local_a0,capturedExpression_00,
             ContinueOnFailure);
  local_a0._8_2_ = 0x101;
  local_a0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001be3e8;
  local_a0._12_4_ = 1;
  local_90 = "==";
  local_88 = (char *)0x2;
  local_80 = 1;
  Catch::AssertionHandler::handleExpr(&local_70,&local_a0);
  Catch::ITransientExpression::~ITransientExpression(&local_a0);
  Catch::AssertionHandler::complete(&local_70);
  if (local_70.m_completed == false) {
    (*(local_70.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  return;
}

Assistant:

void verifyChunk( const TextRecord& chunk ) {

  CHECK( "The new R-matrix analysis of the N-N system on which the ENDF/B-  " == chunk.text() );
  CHECK( 1 == chunk.NC() );
}